

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O0

bool_t cmdTermEcho(bool_t on)

{
  int in_EDI;
  termios attr;
  bool_t prev;
  termios local_44;
  uint local_8;
  int local_4;
  
  local_4 = in_EDI;
  fflush(_stdout);
  tcgetattr(0,&local_44);
  local_8 = (uint)((local_44.c_lflag & 8) != 0);
  if (local_4 == 0) {
    local_44.c_lflag = local_44.c_lflag & 0xfffffff7;
  }
  else {
    local_44.c_lflag = local_44.c_lflag | 8;
  }
  tcsetattr(0,0,&local_44);
  return local_8;
}

Assistant:

static bool_t cmdTermEcho(bool_t on)
{
	bool_t prev;
	struct termios attr;
	fflush(stdout);
	tcgetattr(STDIN_FILENO, &attr);
	prev = (attr.c_lflag & ECHO) != 0;
	if (on)
		attr.c_lflag |= ECHO;
	else
		attr.c_lflag &= ~ECHO;
	tcsetattr(STDIN_FILENO, TCSANOW, &attr);
	return prev;
}